

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

bool __thiscall CInput::KeyState(CInput *this,int Key)

{
  uint uVar1;
  
  if ((uint)Key < 0x1da) {
    if ((uint)Key < 0x19b) {
      uVar1 = Key - 0x80U | 0x40000000;
      if ((uint)Key < 0x80) {
        uVar1 = Key;
      }
      Key = SDL_GetScancodeFromKey(uVar1);
    }
    return this->m_aInputState[Key];
  }
  return false;
}

Assistant:

bool CInput::KeyState(int Key) const
{
	return Key >= KEY_FIRST
		&& Key < KEY_LAST
		&& m_aInputState[Key>=KEY_MOUSE_1 ? Key : SDL_GetScancodeFromKey(KeyToKeycode(Key))];
}